

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall StringWriter_WriteTwoStrings_Test::TestBody(StringWriter_WriteTwoStrings_Test *this)

{
  bool bVar1;
  archive_result_type<pstore::serialize::archive::vector_writer_&> aVar2;
  char *pcVar3;
  AssertHelper local_c0;
  Message local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  uint local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  archive_result_type<pstore::serialize::archive::vector_writer_&> local_50;
  size_t s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  archive_result_type<pstore::serialize::archive::vector_writer_&> local_18;
  size_t s1;
  StringWriter_WriteTwoStrings_Test *this_local;
  
  s1 = (size_t)this;
  s_abi_cxx11_(&local_38,"a",1);
  aVar2 = pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
                    (&(this->super_StringWriter).writer_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_18 = aVar2;
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,"b",1);
  aVar2 = pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
                    (&(this->super_StringWriter).writer_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_84 = 0;
  local_50 = aVar2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_80,"0U","s1",&local_84,&local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"3U","s2",&local_ac,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F (StringWriter, WriteTwoStrings) {
    std::size_t s1 = pstore::serialize::write (writer_, "a"s);
    std::size_t s2 = pstore::serialize::write (writer_, "b"s);
    EXPECT_EQ (0U, s1);
    EXPECT_EQ (3U, s2);
}